

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCube_GL::AttachToFramebuffer
          (TextureCube_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  PFNGLFRAMEBUFFERTEXTUREPROC p_Var1;
  PFNGLFRAMEBUFFERTEXTURE2DPROC p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  FRAMEBUFFER_TARGET_FLAGS FVar5;
  GLuint GVar6;
  Char *pCVar7;
  TextureCube_GL *pTVar8;
  undefined1 local_130 [8];
  string msg_6;
  string msg_5;
  undefined1 local_e8 [4];
  GLenum err_3;
  string msg_4;
  undefined1 local_c0 [4];
  GLenum err_2;
  string msg_3;
  undefined1 local_98 [4];
  GLenum CubeMapFaceBindTarget;
  string msg_2;
  undefined1 local_70 [4];
  GLenum err_1;
  string msg_1;
  GLenum err;
  undefined1 local_40 [8];
  string msg;
  FRAMEBUFFER_TARGET_FLAGS Targets_local;
  GLenum AttachmentPoint_local;
  TextureViewDesc *ViewDesc_local;
  TextureCube_GL *this_local;
  
  msg.field_2._8_4_ = Targets;
  msg.field_2._12_4_ = AttachmentPoint;
  if ((ViewDesc->field_6).NumArraySlices ==
      (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      .m_Desc.field_3.ArraySize) {
    pTVar8 = this;
    FVar5 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
    if (FVar5 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET) &&
         (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) {
        FormatString<char[26],char[99]>
                  ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])pTVar8);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x104);
        std::__cxx11::string::~string((string *)local_40);
      }
      uVar3 = msg.field_2._12_4_;
      p_Var1 = __glewFramebufferTexture;
      GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var1)(0x8ca9,uVar3,GVar6,ViewDesc->MostDetailedMip);
      msg_1.field_2._8_4_ = glGetError();
      if (msg_1.field_2._8_4_ != 0) {
        LogError<false,char[50],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x106,(char (*) [50])"Failed to attach texture cube to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_70,(char (*) [6])0x4585f6);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x106);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    FVar5 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_READ);
    uVar3 = msg.field_2._12_4_;
    p_Var1 = __glewFramebufferTexture;
    if (FVar5 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var1)(0x8ca8,uVar3,GVar6,ViewDesc->MostDetailedMip);
      msg_2.field_2._12_4_ = glGetError();
      if (msg_2.field_2._12_4_ != 0) {
        LogError<false,char[50],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x10b,(char (*) [50])"Failed to attach texture cube to read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_98,(char (*) [6])0x4585f6);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x10b);
        std::__cxx11::string::~string((string *)local_98);
      }
    }
  }
  else if ((ViewDesc->field_6).NumArraySlices == 1) {
    pTVar8 = this;
    msg_3.field_2._12_4_ = GetCubeMapFaceBindTarget((ViewDesc->field_5).FirstArraySlice);
    FVar5 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_DRAW);
    if (FVar5 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET) &&
         (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) {
        FormatString<char[26],char[99]>
                  ((string *)local_c0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])pTVar8);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11a);
        std::__cxx11::string::~string((string *)local_c0);
      }
      uVar4 = msg.field_2._12_4_;
      uVar3 = msg_3.field_2._12_4_;
      p_Var2 = __glewFramebufferTexture2D;
      GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var2)(0x8ca9,uVar4,uVar3,GVar6,ViewDesc->MostDetailedMip);
      msg_4.field_2._12_4_ = glGetError();
      if (msg_4.field_2._12_4_ != 0) {
        LogError<false,char[55],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11c,(char (*) [55])"Failed to attach texture cube face to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_e8,(char (*) [6])0x4585f6);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11c);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    FVar5 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_READ);
    uVar4 = msg.field_2._12_4_;
    uVar3 = msg_3.field_2._12_4_;
    p_Var2 = __glewFramebufferTexture2D;
    if (FVar5 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var2)(0x8ca8,uVar4,uVar3,GVar6,ViewDesc->MostDetailedMip);
      msg_5.field_2._12_4_ = glGetError();
      if (msg_5.field_2._12_4_ != 0) {
        LogError<false,char[55],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x121,(char (*) [55])"Failed to attach texture cube face to read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_5.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)((long)&msg_6.field_2 + 8),(char (*) [6])0x4585f6);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x121);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    FormatString<char[70]>
              ((string *)local_130,
               (char (*) [70])
               "Only one slice or the entire cubemap can be attached to a framebuffer");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x126);
    std::__cxx11::string::~string((string *)local_130);
  }
  return;
}

Assistant:

void TextureCube_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    if (ViewDesc.NumArraySlices == m_Desc.ArraySize)
    {
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube to read framebuffer");
        }
    }
    else if (ViewDesc.NumArraySlices == 1)
    {
        // Texture name must either be zero or the name of an existing 3D texture, 1D or 2D array texture,
        // cube map array texture, or multisample array texture.

        auto CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(ViewDesc.FirstArraySlice);
        // For glFramebufferTexture2D, if texture is not zero, textarget must be one of GL_TEXTURE_2D, GL_TEXTURE_RECTANGLE,
        // GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
        // GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
        // or GL_TEXTURE_2D_MULTISAMPLE.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, AttachmentPoint, CubeMapFaceBindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube face to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture2D(GL_READ_FRAMEBUFFER, AttachmentPoint, CubeMapFaceBindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube face to read framebuffer");
        }
    }
    else
    {
        UNEXPECTED("Only one slice or the entire cubemap can be attached to a framebuffer");
    }
}